

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

void * SBGThread(void *pParam)

{
  int iVar1;
  int iVar2;
  long lVar3;
  CRITICAL_SECTION *__mutex;
  SBGDATA *__dest;
  SBGDATA sbgdata;
  SBGDATA local_11e0;
  
  __mutex = SBGCS;
  __dest = sbgdataSBG;
  lVar3 = 0;
  do {
    if (*(void **)((long)addrsSBG + lVar3 * 2) == pParam) {
      iVar2 = 0;
      memset(&local_11e0,0,0x11b0);
      do {
        iVar1 = GetFrameSBG((SBG *)pParam,&local_11e0);
        if (iVar1 != 0) {
          iVar2 = iVar1;
        }
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        memcpy(__dest,&local_11e0,0x11b0);
        *(int *)((long)resSBG + lVar3) = iVar2;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      } while (*(int *)((long)bExitSBG + lVar3) == 0);
      return (void *)0x0;
    }
    __mutex = __mutex + 1;
    __dest = __dest + 1;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x40);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SBGThread(void* pParam)
{
	SBG* pSBG = (SBG*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	SBGDATA sbgdata;

	while (addrsSBG[id] != pSBG)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	memset(&sbgdata, 0, sizeof(SBGDATA));
	for (;;)
	{
#ifdef ENABLE_SBG_SDK_SUPPORT
		mSleep(pSBG->threadperiod);
#endif // ENABLE_SBG_SDK_SUPPORT
		//memset(&sbgdata, 0, sizeof(SBGDATA));
#ifdef ENABLE_SBG_SDK_SUPPORT
		res = GetLatestDataSBG(pSBG, &sbgdata);
		if (res != EXIT_SUCCESS) err = res;
		//if (GetLatestDataSBG(pSBG, &sbgdata) == EXIT_SUCCESS)
#else
		res = GetFrameSBG(pSBG, &sbgdata);
		if (res != EXIT_SUCCESS) err = res;
		//if (GetFrameSBG(pSBG, &sbgdata) == EXIT_SUCCESS)
#endif // ENABLE_SBG_SDK_SUPPORT
		{
			EnterCriticalSection(&SBGCS[id]);
			sbgdataSBG[id] = sbgdata;
			resSBG[id] = err;
			LeaveCriticalSection(&SBGCS[id]);
		}
		if (bExitSBG[id]) break;
	}

	return 0;
}